

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

bcf_hdr_t * bcf_hdr_read(htsFile *hfp)

{
  BGZF *fp;
  bool bVar1;
  int iVar2;
  bcf_hdr_t *hdr;
  ssize_t sVar3;
  char *pcVar4;
  kstream_t *ks;
  size_t sVar5;
  ulong uVar6;
  kstring_t *pkVar7;
  ulong uVar8;
  byte *pbVar9;
  htsFile *tbx;
  char **__ptr;
  bcf_hrec_t *pbVar10;
  uint uVar11;
  undefined8 unaff_RBX;
  kstring_t *htxt;
  ulong uVar12;
  undefined8 unaff_R12;
  ulong uVar13;
  long lVar14;
  uint8_t magic [5];
  int hlen;
  bcf_hdr_t *pbStack_88;
  int iStack_7c;
  htsFile *phStack_78;
  kstring_t *pkStack_70;
  kstring_t kStack_68;
  undefined8 uStack_50;
  byte abStack_48 [8];
  undefined8 uStack_40;
  undefined7 uStack_30;
  undefined1 local_29;
  undefined1 uStack_28;
  char cStack_27;
  undefined1 uStack_26;
  char local_25;
  int local_24;
  
  if ((hfp->format).format != vcf) {
    fp = (hfp->fp).bgzf;
    uStack_40 = 0x1199d6;
    hdr = bcf_hdr_init("r");
    uStack_40 = 0x1199eb;
    sVar3 = bgzf_read(fp,&local_29,5);
    if (sVar3 < 0) {
      uStack_40 = 0x119a90;
      bcf_hdr_read_cold_3();
    }
    else {
      if (local_25 == '\x02' &&
          CONCAT13(uStack_26,CONCAT12(cStack_27,CONCAT11(uStack_28,local_29))) == 0x2464342) {
        uStack_40 = 0x119a4d;
        bgzf_read(fp,&local_24,4);
        uStack_40 = 0x119a58;
        pcVar4 = (char *)malloc((long)local_24);
        uStack_40 = 0x119a69;
        bgzf_read(fp,pcVar4,(long)local_24);
        uStack_40 = 0x119a74;
        bcf_hdr_parse(hdr,pcVar4);
        uStack_40 = 0x119a7c;
        free(pcVar4);
        return hdr;
      }
      if (cStack_27 == 'F' && CONCAT11(uStack_28,local_29) == 0x4342) {
        uStack_40 = 0x119a97;
        bcf_hdr_read_cold_2();
      }
      else if (1 < hts_verbose) {
        uStack_40 = 0x119a9e;
        bcf_hdr_read_cold_1();
      }
      uStack_40 = 0x119a34;
      bcf_hdr_destroy(hdr);
    }
    return (bcf_hdr_t *)0x0;
  }
  uStack_28 = (undefined1)unaff_R12;
  cStack_27 = (char)((ulong)unaff_R12 >> 8);
  uStack_26 = (undefined1)((ulong)unaff_R12 >> 0x10);
  local_25 = (char)((ulong)unaff_R12 >> 0x18);
  local_24 = (int)((ulong)unaff_R12 >> 0x20);
  uStack_30 = (undefined7)unaff_RBX;
  local_29 = (undefined1)((ulong)unaff_RBX >> 0x38);
  pbStack_88 = bcf_hdr_init("r");
  htxt = (kstring_t *)0x0;
  uVar12 = 0;
  uVar13 = 0;
  pkVar7 = &hfp->line;
  pkStack_70 = &hfp->line;
  do {
    do {
      iVar2 = hts_getline(hfp,2,pkVar7);
      if (iVar2 < 0) goto LAB_00119fe5;
    } while (pkVar7->l == 0);
    pcVar4 = (hfp->line).s;
    if (*pcVar4 != '#') {
      if (1 < hts_verbose) {
        vcf_hdr_read_cold_1();
      }
      free(htxt);
      bcf_hdr_destroy(pbStack_88);
      goto LAB_0011a14a;
    }
    if ((pcVar4[1] != '#') && (hfp->fn_aux != (char *)0x0)) {
      kStack_68.l = 0;
      kStack_68.m = 0;
      kStack_68.s = (char *)0x0;
      phStack_78 = hfp;
      uStack_50 = (BGZF *)gzopen();
      ks = ks_init(uStack_50);
      while (iVar2 = ks_getuntil2(ks,0,&kStack_68,&iStack_7c,0), -1 < iVar2) {
        uVar6 = uVar13 + 0xe;
        pkVar7 = htxt;
        if (uVar6 < uVar12) {
LAB_00119bb7:
          builtin_strncpy((char *)((long)&pkVar7->l + uVar13 + 5),"tig=<ID=",8);
          builtin_strncpy((char *)((long)&pkVar7->l + uVar13),"##contig",8);
          *(undefined1 *)((long)&pkVar7->m + uVar13 + 5) = 0;
          uVar13 = uVar13 + 0xd;
          htxt = pkVar7;
        }
        else {
          uVar6 = uVar6 >> 1 | uVar6;
          uVar6 = uVar6 >> 2 | uVar6;
          uVar6 = uVar6 >> 4 | uVar6;
          uVar6 = uVar6 >> 8 | uVar6;
          uVar12 = (uVar6 >> 0x10 | uVar6) + 1;
          pkVar7 = (kstring_t *)realloc(htxt,uVar12);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00119bb7;
        }
        pcVar4 = kStack_68.s;
        sVar5 = strlen(kStack_68.s);
        sVar5 = (size_t)(int)sVar5;
        uVar6 = sVar5 + uVar13 + 1;
        pkVar7 = htxt;
        if (uVar6 < uVar12) {
LAB_00119c4b:
          htxt = pkVar7;
          memcpy((char *)((long)&htxt->l + uVar13),pcVar4,sVar5);
          uVar13 = uVar13 + sVar5;
          *(char *)((long)&htxt->l + uVar13) = '\0';
        }
        else {
          uVar6 = uVar6 >> 1 | uVar6;
          uVar6 = uVar6 >> 2 | uVar6;
          uVar6 = uVar6 >> 4 | uVar6;
          uVar6 = uVar6 >> 8 | uVar6;
          uVar12 = (uVar6 >> 0x10 | uVar6) + 1;
          pkVar7 = (kstring_t *)realloc(htxt,uVar12);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00119c4b;
        }
        ks_getuntil2(ks,0,&kStack_68,&iStack_7c,0);
        uVar6 = uVar13 + 9;
        pkVar7 = htxt;
        if (uVar6 < uVar12) {
LAB_00119cd9:
          htxt = pkVar7;
          builtin_strncpy((char *)((long)&htxt->l + uVar13),",length=",8);
          *(undefined1 *)((long)&htxt->m + uVar13) = 0;
          uVar13 = uVar13 + 8;
        }
        else {
          uVar6 = uVar6 >> 1 | uVar6;
          uVar6 = uVar6 >> 2 | uVar6;
          uVar6 = uVar6 >> 4 | uVar6;
          uVar6 = uVar6 >> 8 | uVar6;
          uVar12 = (uVar6 >> 0x10 | uVar6) + 1;
          pkVar7 = (kstring_t *)realloc(htxt,uVar12);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00119cd9;
        }
        uVar8 = atol(kStack_68.s);
        iVar2 = (int)uVar8;
        uVar6 = (ulong)(uint)-iVar2;
        if (0 < iVar2) {
          uVar6 = uVar8 & 0xffffffff;
        }
        uVar8 = 0;
        do {
          uVar11 = (uint)uVar6;
          abStack_48[uVar8] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
          uVar8 = uVar8 + 1;
          uVar6 = uVar6 / 10;
        } while (9 < uVar11);
        if (iVar2 < 0) {
          uVar6 = uVar8 & 0xffffffff;
          uVar8 = (ulong)((int)uVar8 + 1);
          abStack_48[uVar6] = 0x2d;
        }
        uVar6 = (long)(int)uVar8 + uVar13 + 1;
        pkVar7 = htxt;
        if (uVar6 < uVar12) {
LAB_00119d94:
          htxt = pkVar7;
          pbVar9 = abStack_48 + ((uVar8 & 0xffffffff) - 1);
          iVar2 = (int)uVar8 + 1;
          do {
            *(byte *)((long)&htxt->l + uVar13) = *pbVar9;
            uVar13 = uVar13 + 1;
            iVar2 = iVar2 + -1;
            pbVar9 = pbVar9 + -1;
          } while (1 < iVar2);
          *(char *)((long)&htxt->l + uVar13) = '\0';
        }
        else {
          uVar6 = uVar6 >> 1 | uVar6;
          uVar6 = uVar6 >> 2 | uVar6;
          uVar6 = uVar6 >> 4 | uVar6;
          uVar6 = uVar6 >> 8 | uVar6;
          uVar12 = (uVar6 >> 0x10 | uVar6) + 1;
          pkVar7 = (kstring_t *)realloc(htxt,uVar12);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00119d94;
        }
        uVar6 = uVar13 + 3;
        pkVar7 = htxt;
        if (uVar6 < uVar12) {
LAB_00119e12:
          htxt = pkVar7;
          pcVar4 = (char *)((long)&htxt->l + uVar13);
          pcVar4[0] = '>';
          pcVar4[1] = '\n';
          *(char *)((long)&htxt->l + uVar13 + 2) = '\0';
          uVar13 = uVar13 + 2;
        }
        else {
          uVar6 = uVar6 >> 1 | uVar6;
          uVar6 = uVar6 >> 2 | uVar6;
          uVar6 = uVar6 >> 4 | uVar6;
          uVar6 = uVar6 >> 8 | uVar6;
          uVar12 = (uVar6 >> 0x10 | uVar6) + 1;
          pkVar7 = (kstring_t *)realloc(htxt,uVar12);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00119e12;
        }
        if (iStack_7c != 10) {
          do {
            if (((*(uint *)&ks->field_0x8 & 3) == 0) || (uVar11 = 0xffffffff, ks->begin < ks->end))
            {
              if (ks->end <= ks->begin) {
                ks->begin = 0;
                iVar2 = gzread(ks->f,ks->buf,(int)*(uint *)&ks->field_0x8 >> 2);
                ks->end = iVar2;
                if (iVar2 == 0) {
                  *(uint *)&ks->field_0x8 = (*(uint *)&ks->field_0x8 & 0xfffffffc) + 1;
                  uVar11 = 0xffffffff;
                  goto LAB_00119e8b;
                }
              }
              ks->seek_pos = ks->seek_pos + 1;
              iVar2 = ks->begin;
              ks->begin = iVar2 + 1;
              uVar11 = (uint)ks->buf[iVar2];
            }
LAB_00119e8b:
          } while ((uVar11 != 10) && (uVar11 != 0xffffffff));
        }
      }
      free(kStack_68.s);
      ks_destroy(ks);
      gzclose(uStack_50);
      hfp = phStack_78;
    }
    pcVar4 = (hfp->line).s;
    sVar5 = (size_t)(int)(hfp->line).l;
    uVar6 = sVar5 + uVar13 + 1;
    pkVar7 = htxt;
    if (uVar6 < uVar12) {
LAB_00119f4e:
      memcpy((char *)((long)&pkVar7->l + uVar13),pcVar4,sVar5);
      uVar13 = uVar13 + sVar5;
      *(char *)((long)&pkVar7->l + uVar13) = '\0';
      htxt = pkVar7;
    }
    else {
      uVar6 = uVar6 >> 1 | uVar6;
      uVar6 = uVar6 >> 2 | uVar6;
      uVar6 = uVar6 >> 4 | uVar6;
      uVar6 = uVar6 >> 8 | uVar6;
      uVar12 = (uVar6 >> 0x10 | uVar6) + 1;
      pkVar7 = (kstring_t *)realloc(htxt,uVar12);
      if (pkVar7 != (kstring_t *)0x0) goto LAB_00119f4e;
    }
    uVar6 = uVar13 + 1;
    pkVar7 = htxt;
    if (uVar6 < uVar12) {
LAB_00119fbb:
      pcVar4 = (char *)((long)&pkVar7->l + uVar13);
      pcVar4[0] = '\n';
      pcVar4[1] = '\0';
      uVar13 = uVar6;
      htxt = pkVar7;
    }
    else {
      uVar12 = uVar6 >> 1 | uVar6;
      uVar12 = uVar12 >> 2 | uVar12;
      uVar12 = uVar12 >> 4 | uVar12;
      uVar12 = uVar12 >> 8 | uVar12;
      uVar12 = (uVar12 >> 0x10 | uVar12) + 1;
      pkVar7 = (kstring_t *)realloc(htxt,uVar12);
      if (pkVar7 != (kstring_t *)0x0) goto LAB_00119fbb;
    }
    pkVar7 = pkStack_70;
  } while ((hfp->line).s[1] == '#');
LAB_00119fe5:
  if (htxt == (kstring_t *)0x0) {
    vcf_hdr_read_cold_2();
LAB_0011a14a:
    pbStack_88 = (bcf_hdr_t *)0x0;
  }
  else {
    bcf_hdr_parse(pbStack_88,(char *)htxt);
    tbx = (htsFile *)tbx_index_load(hfp->fn);
    if (tbx != (htsFile *)0x0) {
      pkStack_70 = htxt;
      __ptr = tbx_seqnames((tbx_t *)tbx,(int *)&kStack_68);
      if ((int)kStack_68.l < 1) {
        free(__ptr);
        tbx_destroy((tbx_t *)tbx);
        htxt = pkStack_70;
      }
      else {
        lVar14 = 0;
        bVar1 = false;
        phStack_78 = tbx;
        do {
          pbVar10 = bcf_hdr_get_hrec(pbStack_88,3,"ID",__ptr[lVar14],(char *)0x0);
          if (pbVar10 == (bcf_hrec_t *)0x0) {
            pbVar10 = (bcf_hrec_t *)calloc(1,0x30);
            pcVar4 = strdup("contig");
            pbVar10->key = pcVar4;
            bcf_hrec_add_key(pbVar10,"ID",2);
            iVar2 = pbVar10->nkeys;
            pcVar4 = __ptr[lVar14];
            sVar5 = strlen(pcVar4);
            bcf_hrec_set_val(pbVar10,iVar2 + -1,pcVar4,(int)sVar5,0);
            bcf_hdr_add_hrec(pbStack_88,pbVar10);
            bVar1 = true;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)kStack_68.l);
        free(__ptr);
        tbx_destroy((tbx_t *)phStack_78);
        htxt = pkStack_70;
        if (bVar1) {
          bcf_hdr_sync(pbStack_88);
          htxt = pkStack_70;
        }
      }
    }
    free(htxt);
  }
  return pbStack_88;
}

Assistant:

bcf_hdr_t *bcf_hdr_read(htsFile *hfp)
{
    if (hfp->format.format == vcf)
        return vcf_hdr_read(hfp);

    BGZF *fp = hfp->fp.bgzf;
    uint8_t magic[5];
    bcf_hdr_t *h;
    h = bcf_hdr_init("r");
    if ( bgzf_read(fp, magic, 5)<0 )
    {
        fprintf(stderr,"[%s:%d %s] Failed to read the header (reading BCF in text mode?)\n", __FILE__,__LINE__,__FUNCTION__);
        return NULL;
    }
    if (strncmp((char*)magic, "BCF\2\2", 5) != 0)
    {
        if (!strncmp((char*)magic, "BCF", 3))
            fprintf(stderr,"[%s:%d %s] invalid BCF2 magic string: only BCFv2.2 is supported.\n", __FILE__,__LINE__,__FUNCTION__);
        else if (hts_verbose >= 2)
            fprintf(stderr, "[E::%s] invalid BCF2 magic string\n", __func__);
        bcf_hdr_destroy(h);
        return 0;
    }
    int hlen;
    char *htxt;
    bgzf_read(fp, &hlen, 4);
    htxt = (char*)malloc(hlen);
    bgzf_read(fp, htxt, hlen);
    bcf_hdr_parse(h, htxt);
    free(htxt);
    return h;
}